

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

RegVmReturnType __thiscall
ExecutorRegVm::ExecReturn
          (ExecutorRegVm *this,RegVmCmd cmd,RegVmCmd *instruction,RegVmRegister *regFilePtr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  RegVmReturnType RVar4;
  uint *puVar5;
  uint size;
  uint offset;
  uint reg;
  uint typeId;
  uint *microcode;
  byte local_39;
  uint *puStack_38;
  bool errorState;
  uint *tempStackPtr;
  RegVmRegister *regFilePtr_local;
  RegVmCmd *instruction_local;
  ExecutorRegVm *this_local;
  RegVmCmd cmd_local;
  
  puStack_38 = this->tempStackArrayBase;
  this_local._6_1_ = cmd.rB;
  tempStackPtr = (uint *)regFilePtr;
  regFilePtr_local = (RegVmRegister *)instruction;
  instruction_local = (RegVmCmd *)this;
  unique0x100002a2 = cmd;
  if (this_local._6_1_ == '\x05') {
    bVar2 = FastVector<RegVmCmd_*,_false,_false>::empty(&this->callStack);
    local_39 = (bVar2 ^ 0xffU) & 1;
    microcode = (uint *)(regFilePtr_local + 1);
    FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,(RegVmCmd **)&microcode);
    if ((local_39 & 1) != 0) {
      Stop(this,"ERROR: function didn\'t return a value");
    }
    this->codeRunning = false;
    cmd_local.code = '\0';
    cmd_local.rA = '\0';
    cmd_local.rB = '\0';
    cmd_local.rC = '\0';
    if ((local_39 & 1) != 0) {
      cmd_local.code = '\x05';
      cmd_local.rA = '\0';
      cmd_local.rB = '\0';
      cmd_local.rC = '\0';
    }
  }
  else {
    bVar2 = this_local._6_1_ != '\0';
    if (bVar2) {
      puVar5 = (this->exLinker->exRegVmConstants).data + ((ulong)cmd >> 0x20);
      uVar3 = *puVar5;
      puVar5 = puVar5 + 2;
      while (_reg = puVar5, *_reg != 7) {
        puVar5 = _reg + 1;
        switch(*_reg) {
        case 2:
          *puStack_38 = tempStackPtr[(ulong)*puVar5 * 2];
          puStack_38 = puStack_38 + 1;
          puVar5 = _reg + 2;
          break;
        case 3:
          *(undefined8 *)puStack_38 = *(undefined8 *)(tempStackPtr + (ulong)*puVar5 * 2);
          puStack_38 = puStack_38 + 2;
          puVar5 = _reg + 2;
          break;
        case 4:
          *puStack_38 = *puVar5;
          puStack_38 = puStack_38 + 1;
          puVar5 = _reg + 2;
          break;
        case 5:
          anon_unknown.dwarf_1687fe::vmStoreLong(puStack_38,(ulong)*puVar5);
          puStack_38 = puStack_38 + 2;
          puVar5 = _reg + 2;
          break;
        case 6:
          uVar1 = _reg[3];
          memcpy(puStack_38,(void *)(*(long *)(tempStackPtr + (ulong)*puVar5 * 2) + (ulong)_reg[2]),
                 (ulong)uVar1);
          puStack_38 = puStack_38 + (uVar1 >> 2);
          puVar5 = _reg + 4;
        }
      }
      if (this_local._7_1_ != '\0') {
        ExecCheckedReturn(this,uVar3,(RegVmRegister *)tempStackPtr);
      }
    }
    uVar3 = FastVector<RegVmCmd_*,_false,_false>::size(&this->callStack);
    if (uVar3 == this->lastFinalReturn) {
      if (this->lastFinalReturn == 0) {
        this->codeRunning = false;
      }
      cmd_local._0_4_ = ZEXT14(this_local._6_1_);
    }
    else {
      FastVector<RegVmCmd_*,_false,_false>::pop_back(&this->callStack);
      cmd_local._0_4_ = ZEXT14(this_local._6_1_);
    }
  }
  RVar4._0_1_ = cmd_local.code;
  RVar4._1_1_ = cmd_local.rA;
  RVar4._2_1_ = cmd_local.rB;
  RVar4._3_1_ = cmd_local.rC;
  return RVar4;
}

Assistant:

RegVmReturnType ExecutorRegVm::ExecReturn(const RegVmCmd cmd, RegVmCmd * const instruction, RegVmRegister * const regFilePtr)
{
	unsigned *tempStackPtr = tempStackArrayBase;

	if(cmd.rB == rvrError)
	{
		bool errorState = !callStack.empty();

		callStack.push_back(instruction + 1);

		if(errorState)
			Stop("ERROR: function didn't return a value");

		codeRunning = false;

		return errorState ? rvrError : rvrVoid;
	}

	if(cmd.rB != rvrVoid)
	{
		unsigned *microcode = exLinker->exRegVmConstants.data + cmd.argument;

		unsigned typeId = *microcode++;

		// Skip type size
		microcode++;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPush:
				*tempStackPtr = regFilePtr[*microcode++].intValue;
				tempStackPtr += 1;
				break;
			case rvmiPushQword:
				memcpy(tempStackPtr, &regFilePtr[*microcode++].longValue, sizeof(long long));
				tempStackPtr += 2;
				break;
			case rvmiPushImm:
				*tempStackPtr = *microcode++;
				tempStackPtr += 1;
				break;
			case rvmiPushImmq:
				vmStoreLong(tempStackPtr, *microcode++);
				tempStackPtr += 2;
				break;
			case rvmiPushMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;
				memcpy(tempStackPtr, (char*)regFilePtr[reg].ptrValue + offset, size);
				tempStackPtr += size >> 2;
			}
			break;
			}
		}

		if(cmd.rC)
			ExecCheckedReturn(typeId, regFilePtr);
	}

	if(callStack.size() == lastFinalReturn)
	{
		if(lastFinalReturn == 0)
			codeRunning = false;

		return RegVmReturnType(cmd.rB);
	}

	callStack.pop_back();

	return RegVmReturnType(cmd.rB);
}